

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintDebugDataRTL(ostream *debugStream,quadlet_t *data,char *portName)

{
  ostream *poVar1;
  void *this;
  DebugData *p;
  char *portName_local;
  quadlet_t *data_local;
  ostream *debugStream_local;
  
  poVar1 = std::operator<<(debugStream,"*** ");
  poVar1 = std::operator<<(poVar1,portName);
  poVar1 = std::operator<<(poVar1," (RTL8211F): ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(debugStream,"numReset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)((long)data + 6));
  poVar1 = std::operator<<(poVar1,", numIRQ: ");
  this = (void *)std::ostream::operator<<(poVar1,(ushort)data[1]);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void EthBasePort::PrintDebugDataRTL(std::ostream &debugStream, const quadlet_t *data, const char *portName)
{
    struct DebugData {
        uint32_t mdio_result;
        uint16_t numIRQ;
        uint16_t numReset;
    };
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    debugStream << "*** " << portName << " (RTL8211F): " << std::endl;
    debugStream << "numReset: " << p->numReset << ", numIRQ: " << p->numIRQ << std::endl;
}